

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void google::protobuf::compiler::anon_unknown_0::SortMessages
               (FileDescriptorProto *file_descriptor_proto)

{
  int iVar1;
  DescriptorProto *descriptor_proto;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this;
  DescriptorProto **ppDVar2;
  DescriptorProto **data;
  int i;
  int size;
  FileDescriptorProto *file_descriptor_proto_local;
  
  iVar1 = FileDescriptorProto::message_type_size(file_descriptor_proto);
  for (data._0_4_ = 0; (int)data < iVar1; data._0_4_ = (int)data + 1) {
    descriptor_proto = FileDescriptorProto::mutable_message_type(file_descriptor_proto,(int)data);
    SortMessages(descriptor_proto);
  }
  this = FileDescriptorProto::mutable_message_type(file_descriptor_proto);
  ppDVar2 = RepeatedPtrField<google::protobuf::DescriptorProto>::mutable_data(this);
  std::
  sort<google::protobuf::DescriptorProto**,google::protobuf::compiler::(anonymous_namespace)::CompareDescriptorNames>
            (ppDVar2,ppDVar2 + iVar1);
  return;
}

Assistant:

void SortMessages(FileDescriptorProto* file_descriptor_proto) {
  int size = file_descriptor_proto->message_type_size();
  // recursively sort; we can't guarantee the order of nested messages either
  for (int i = 0; i < size; ++i) {
    SortMessages(file_descriptor_proto->mutable_message_type(i));
  }
  DescriptorProto** data =
      file_descriptor_proto->mutable_message_type()->mutable_data();
  std::sort(data, data + size, CompareDescriptorNames());
}